

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsRbTree.h
# Opt level: O2

int __thiscall
highs::RbTree<HighsNodeQueue::NodeHybridEstimRbTree>::link
          (RbTree<HighsNodeQueue::NodeHybridEstimRbTree> *this,char *__from,char *__to)

{
  bool bVar1;
  int iVar2;
  char *__to_00;
  char *node;
  tuple<double,_int,_long> tStack_58;
  tuple<double,_int,_long> local_40;
  
  __to_00 = (char *)0xffffffffffffffff;
  for (node = (char *)*this->rootNode; node != (char *)0xffffffffffffffff;
      node = *(char **)((long)node * 0x90 + this[2].rootNode[1] + 0x78 + (ulong)bVar1 * 8)) {
    HighsNodeQueue::NodeHybridEstimRbTree::getKey
              (&local_40,(NodeHybridEstimRbTree *)this,(int64_t)node);
    HighsNodeQueue::NodeHybridEstimRbTree::getKey
              (&tStack_58,(NodeHybridEstimRbTree *)this,(int64_t)__from);
    bVar1 = std::
            __tuple_compare<std::tuple<double,_int,_long>,_std::tuple<double,_int,_long>,_0UL,_3UL>
            ::__less(&local_40,&tStack_58);
    __to_00 = node;
  }
  iVar2 = CacheMinRbTree<HighsNodeQueue::NodeHybridEstimRbTree>::link
                    ((CacheMinRbTree<HighsNodeQueue::NodeHybridEstimRbTree> *)this,__from,__to_00);
  return iVar2;
}

Assistant:

void link(LinkType z) {
    LinkType y = kNoLink;
    LinkType x = rootNode;
    while (x != kNoLink) {
      y = x;
      x = getChild(y, Dir(getKey(x) < getKey(z)));
    }

    static_cast<Impl*>(this)->link(z, y);
  }